

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O3

void __thiscall
txpackage_tests::package_validation_tests::test_method(package_validation_tests *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CKey input_signing_key;
  CKey input_signing_key_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  unsigned_long uVar10;
  Chainstate *pCVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  CAmount CVar14;
  int64_t iVar15;
  iterator iVar16;
  long lVar17;
  iterator pvVar18;
  PackageMempoolAcceptResult *client_maxfeerate;
  iterator pvVar19;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *client_maxfeerate_00;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  undefined4 uVar24;
  check_type cVar27;
  undefined8 uVar25;
  undefined8 in_stack_fffffffffffffa18;
  undefined8 in_stack_fffffffffffffa20;
  package_validation_tests *ppVar26;
  CAmount in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa30;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined4 local_56c;
  assertion_result local_568;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  Package package_single_giant;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  CTransactionRef giant_ptx;
  unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> local_4a0;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_498;
  char *local_490;
  SignalInterrupt *local_488;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> local_480;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_478;
  char *local_470;
  unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_468;
  char *local_460;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> local_458;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> local_450;
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_448;
  char *local_440;
  pointer local_438;
  pointer local_430;
  pointer local_428;
  char *local_420;
  pointer local_418;
  pointer local_410;
  pointer local_408;
  char *local_400;
  WalletLoader *local_3f8;
  char *local_3f0;
  _Any_data local_3e8;
  _Manager_type local_3d8;
  char *local_3d0;
  unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_> local_3c8;
  char *local_3c0;
  char *local_3b8;
  unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> local_3b0;
  thread local_3a8;
  char *local_3a0;
  char *local_398;
  Package package_parent_child;
  CTransactionRef tx_child;
  undefined1 local_368 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_360;
  element_type *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  undefined1 local_348 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_340;
  CTransactionRef tx_parent;
  undefined1 local_328 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_320;
  _Alloc_hider local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  undefined1 local_308 [20];
  uint initialPoolSize;
  _Alloc_hider local_2f0;
  assertion_result local_2e8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_2d0;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [16];
  assertion_result local_2b0;
  assertion_result local_298;
  _Base_ptr local_280;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_258;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_single_large;
  PackageMempoolAcceptResult result_single_large;
  PackageMempoolAcceptResult result_parent_child;
  direct_or_indirect local_128;
  undefined4 local_10c;
  CMutableTransaction mtx_child;
  direct_or_indirect local_d0;
  undefined4 local_b4;
  direct_or_indirect local_b0;
  uint local_94;
  CMutableTransaction mtx_parent;
  direct_or_indirect local_58;
  undefined4 local_3c;
  _Manager_type local_38;
  
  local_38 = *(_Manager_type *)(in_FS_OFFSET + 0x28);
  criticalblock13.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock13.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock13.super_unique_lock);
  uVar10 = CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                            super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                            m_node.mempool._M_t.
                            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
                            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  initialPoolSize = (uint)uVar10;
  GenerateRandomKey(SUB81((CKey *)local_308,0));
  CKey::GetPubKey((CPubKey *)&result_single_large,(CKey *)local_308);
  PKHash::PKHash((PKHash *)&mtx_parent,(CPubKey *)&result_single_large);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_parent_child.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination
            ((CScript *)&local_58.indirect_contents,(CTxDestination *)&result_parent_child);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_parent_child);
  psVar5 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_318._M_p =
       (pointer)(psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_310 = (psVar5->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_310->_M_use_count = local_310->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_310->_M_use_count = local_310->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_328,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey);
  uVar25 = 0x682be7;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b0.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x124101100;
  input_signing_key._0_8_ = &local_b0;
  auVar7._8_8_ = in_stack_fffffffffffffa18;
  auVar7._0_8_ = uVar25;
  auVar7._16_8_ = in_stack_fffffffffffffa20;
  auVar7._24_8_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_318;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction,0,(int)local_328,
             input_signing_key,(CScript)(auVar7 << 0x40),in_stack_fffffffffffffa28,
             (bool)in_stack_fffffffffffffa30);
  if (0x1c < local_94) {
    free(local_b0.indirect_contents.indirect);
    local_b0.indirect_contents.indirect = (char *)0x0;
  }
  if (local_320._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_320,
               local_320._M_head_impl);
  }
  local_320._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310);
  }
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent,
             (allocator<CTransaction> *)&result_parent_child,&mtx_parent);
  GenerateRandomKey(SUB81((CKey *)local_348,0));
  CKey::GetPubKey((CPubKey *)&result_single_large,(CKey *)local_348);
  PKHash::PKHash((PKHash *)&mtx_child,(CPubKey *)&result_single_large);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       CONCAT44(result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                m_reject_reason._M_string_length._4_4_,
                mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)mtx_child.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  result_parent_child.m_tx_results._M_t._M_impl._0_1_ = 2;
  GetScriptForDestination
            ((CScript *)&local_d0.indirect_contents,(CTxDestination *)&result_parent_child);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&result_parent_child);
  local_358 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_350 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_368,(CKey *)local_308);
  uVar25 = 0x682d89;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents);
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x11e1a3000;
  input_signing_key_00._0_8_ = &local_128;
  auVar8._8_8_ = in_stack_fffffffffffffa18;
  auVar8._0_8_ = uVar25;
  auVar8._16_8_ = in_stack_fffffffffffffa20;
  auVar8._24_8_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_358;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_child,(TestChain100Setup *)this,input_transaction_00,0x65,(int)local_368,
             input_signing_key_00,(CScript)(auVar8 << 0x40),in_stack_fffffffffffffa28,
             (bool)in_stack_fffffffffffffa30);
  if (0x1c < (uint)local_10c) {
    free(local_128.indirect_contents.indirect);
    local_128.indirect_contents.indirect = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_360._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_360,
               local_360._M_head_impl);
  }
  local_360._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
  }
  tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child,(allocator<CTransaction> *)&result_parent_child
             ,&mtx_child);
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length =
       (size_type)tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
  ._M_allocated_capacity =
       (size_type)
       tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&result_parent_child;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_parent_child,__l,(allocator_type *)&result_single_large);
  lVar17 = 0x20;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&result_single_large.m_tx_results._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + lVar17);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != 0);
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &result_single_large;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  ProcessNewPackage(&result_parent_child,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_parent_child,
                    true,(optional<CFeeRate> *)client_maxfeerate);
  pvVar18 = (iterator)0x0;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&result_single_large,&package_parent_child,&result_parent_child,true,
             (CTxMemPool *)0x0);
  if (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      field_2._M_local_buf[8] == '\x01') {
    local_3a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_398 = "";
    local_3b0._M_t.super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
    super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
    super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::Warnings,_std::default_delete<node::Warnings>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    local_3a8._M_id._M_thread = (id)&boost::unit_test::basic_cstring<char_const>::null;
    _cVar27 = 0x682fba;
    file.m_end = (iterator)0xe3;
    file.m_begin = (iterator)&local_3a0;
    msg.m_end = (iterator)client_maxfeerate;
    msg.m_begin = pvVar18;
    ppVar26 = this;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3b0,msg);
    local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
    local_298.m_message.px = (element_type *)0x0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
    if (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
        field_2._M_local_buf[8] == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388e08;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3b8 = "";
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x1;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &result_single_large;
    boost::test_tools::tt_detail::report_assertion
              (&local_298,(lazy_ostream *)&err_single_large,1,1,WARN,_cVar27,(size_t)&local_3c0,0xe3
              );
    boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  }
  else {
    cVar12 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_parent_child.m_tx_results._M_t,
                    &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    cVar13 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_parent_child.m_tx_results._M_t,
                    &((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped);
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3c8._M_t.
    super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
    ._M_t.
    super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
    .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
         (__uniq_ptr_data<node::KernelNotifications,_std::default_delete<node::KernelNotifications>,_true,_true>
          )((long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
           + 0x68);
    local_3e8._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d8 = (_Manager_type)&boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xe8;
    file_00.m_begin = (iterator)&local_3d0;
    msg_00.m_end = (iterator)client_maxfeerate;
    msg_00.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(long)&local_3e8 + 8,
               msg_00);
    if (*(char *)&cVar12._M_node[6]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    iVar15 = GetVirtualTransactionSize
                       (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,0,0);
    _cVar27 = 0x6830f7;
    CVar14 = CFeeRate::GetFee((CFeeRate *)&cVar12._M_node[6]._M_parent,(uint32_t)iVar15);
    local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(CVar14 == 100000000);
    local_298.m_message.px = (element_type *)0x0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_2e8;
    local_2e8._0_8_ =
         "it_parent->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_parent)) == COIN"
    ;
    local_2e8.m_message.px = (element_type *)"";
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01389048;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3e8._M_unused._M_object = "";
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_298,(lazy_ostream *)&err_single_large,1,0,WARN,_cVar27,(size_t)&local_3f0,0xe8
              );
    boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
    local_400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_3f8 = (WalletLoader *)0xf4389f;
    local_410 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_408 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xe9;
    file_01.m_begin = (iterator)&local_400;
    msg_01.m_end = pvVar19;
    msg_01.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_410,
               msg_01);
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2d0._M_head_impl = (_Impl *)0xf4aea1;
    if (*(char *)&cVar12._M_node[7]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    lVar17 = *(long *)(cVar12._M_node + 7) - (long)cVar12._M_node[6]._M_right;
    local_2c0._0_8_ = lVar17 >> 5;
    local_2b0._0_8_ = local_2c0;
    package_single_giant.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = &giant_ptx;
    giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         M_INVALID;
    local_568.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(lVar17 == 0x20);
    local_568.m_message.px = (element_type *)0x0;
    local_568.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_268._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_268._8_8_ = (element_type *)0xf4389f;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_2b0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f48;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)&package_single_giant;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_013890c8;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_568,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xf440fd,(size_t)local_268,0xe9,
               (lazy_ostream *)&err_single_large,"1",(int)&local_298);
    boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
    local_420 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_418 = (pointer)0xf4389f;
    local_430 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_428 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xea;
    file_02.m_begin = (iterator)&local_420;
    msg_02.m_end = pvVar19;
    msg_02.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_430,
               msg_02);
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2d0._M_head_impl = (_Impl *)0xf4aea1;
    if (*(char *)&cVar12._M_node[7]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    local_2b0._0_8_ = cVar12._M_node[6]._M_right;
    package_single_giant.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&(tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash;
    uVar1 = ((_Base_ptr)local_2b0._0_8_)->_M_left;
    uVar3 = ((_Base_ptr)local_2b0._0_8_)->_M_right;
    auVar22[0] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                  (char)((_Base_ptr)local_2b0._0_8_)->_M_color);
    auVar22[1] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 1));
    auVar22[2] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 2));
    auVar22[3] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 3));
    auVar22[4] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x4);
    auVar22[5] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x5);
    auVar22[6] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x6);
    auVar22[7] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x7);
    auVar22[8] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                  *(uchar *)&((_Base_ptr)local_2b0._0_8_)->_M_parent);
    auVar22[9] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                  *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 1));
    auVar22[10] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                   *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 2));
    auVar22[0xb] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 3));
    auVar22[0xc] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 4));
    auVar22[0xd] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 5));
    auVar22[0xe] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 6));
    auVar22[0xf] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 7));
    auVar20[0] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                  == (uchar)uVar1);
    auVar20[1] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                  == (uchar)((ulong)uVar1 >> 8));
    auVar20[2] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                  == (uchar)((ulong)uVar1 >> 0x10));
    auVar20[3] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                  == (uchar)((ulong)uVar1 >> 0x18));
    auVar20[4] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                  == (uchar)((ulong)uVar1 >> 0x20));
    auVar20[5] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                  == (uchar)((ulong)uVar1 >> 0x28));
    auVar20[6] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                  == (uchar)((ulong)uVar1 >> 0x30));
    auVar20[7] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                  == (uchar)((ulong)uVar1 >> 0x38));
    auVar20[8] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                  == (uchar)uVar3);
    auVar20[9] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                  == (uchar)((ulong)uVar3 >> 8));
    auVar20[10] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                   == (uchar)((ulong)uVar3 >> 0x10));
    auVar20[0xb] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                    == (uchar)((ulong)uVar3 >> 0x18));
    auVar20[0xc] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                    == (uchar)((ulong)uVar3 >> 0x20));
    auVar20[0xd] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                    == (uchar)((ulong)uVar3 >> 0x28));
    auVar20[0xe] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                    == (uchar)((ulong)uVar3 >> 0x30));
    auVar20[0xf] = -(((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                    == (uchar)((ulong)uVar3 >> 0x38));
    auVar20 = auVar20 & auVar22;
    local_568.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
    local_568.m_message.px = (element_type *)0x0;
    local_568.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_268._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_268._8_8_ = (element_type *)0xf4389f;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0a0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_2b0;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_0138e0a0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)&package_single_giant;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_568,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xf44138,(size_t)local_268,0xea,
               (lazy_ostream *)&err_single_large,"tx_parent->GetWitnessHash()",(int)&local_298);
    boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_438 = (pointer)0xf4389f;
    local_450._M_t.super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
    ._M_t.super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
    super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<ChainstateManager,_std::default_delete<ChainstateManager>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    local_448._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
         (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0xec;
    file_03.m_begin = (iterator)&local_440;
    msg_03.m_end = pvVar19;
    msg_03.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_450,
               msg_03);
    if (*(char *)&cVar13._M_node[6]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    iVar15 = GetVirtualTransactionSize
                       (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,0,0);
    _cVar27 = 0x68354d;
    CVar14 = CFeeRate::GetFee((CFeeRate *)&cVar13._M_node[6]._M_parent,(uint32_t)iVar15);
    local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(CVar14 == 100000000);
    local_298.m_message.px = (element_type *)0x0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2e8._0_8_ =
         "it_child->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_child)) == COIN"
    ;
    local_2e8.m_message.px = (element_type *)"";
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01389048;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_458._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
    super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)
         ((long)
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68);
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = (lazy_ostream *)&local_2e8;
    boost::test_tools::tt_detail::report_assertion
              (&local_298,(lazy_ostream *)&err_single_large,1,0,WARN,_cVar27,(size_t)&local_460,0xec
              );
    boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_468._M_t.
    super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
    super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
    super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_NetGroupManager,_std::default_delete<const_NetGroupManager>,_true,_true>
          )((long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
           + 0x68);
    local_480._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    local_478._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
    super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
    super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
         (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xed;
    file_04.m_begin = (iterator)&local_470;
    msg_04.m_end = pvVar19;
    msg_04.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_480,
               msg_04);
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2d0._M_head_impl = (_Impl *)0xf4aea1;
    if (*(char *)&cVar13._M_node[7]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    lVar17 = *(long *)(cVar13._M_node + 7) - (long)cVar13._M_node[6]._M_right;
    local_2c0._0_8_ = lVar17 >> 5;
    giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         M_INVALID;
    local_568.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(lVar17 == 0x20);
    local_568.m_message.px = (element_type *)0x0;
    local_568.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_268._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_268._8_8_ = (element_type *)0xf4389f;
    local_2b0._0_8_ = local_2c0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f48;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_2b0;
    package_single_giant.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = &giant_ptx;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_013890c8;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)&package_single_giant;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    uVar24 = SUB84(&local_298,0);
    boost::test_tools::tt_detail::report_assertion
              (&local_568,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xf441f2,(size_t)local_268,0xed,
               (lazy_ostream *)&err_single_large,"1",uVar24);
    boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_488 = (SignalInterrupt *)0xf4389f;
    local_4a0._M_t.super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>.
    _M_t.super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
    super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl =
         (__uniq_ptr_data<kernel::Context,_std::default_delete<kernel::Context>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    local_498._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
    super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
    super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
         (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
         &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xee;
    file_05.m_begin = (iterator)&local_490;
    msg_05.m_end = pvVar19;
    msg_05.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4a0,
               msg_05);
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_01388f08;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2d0._M_head_impl = (_Impl *)0xf4aea1;
    if (*(char *)&cVar13._M_node[7]._M_left == '\0') {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    local_2b0._0_8_ = cVar13._M_node[6]._M_right;
    package_single_giant.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&(tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash;
    uVar2 = ((_Base_ptr)local_2b0._0_8_)->_M_left;
    uVar4 = ((_Base_ptr)local_2b0._0_8_)->_M_right;
    auVar23[0] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                  (char)((_Base_ptr)local_2b0._0_8_)->_M_color);
    auVar23[1] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 1));
    auVar23[2] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 2));
    auVar23[3] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                  *(byte *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_color + 3));
    auVar23[4] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x4);
    auVar23[5] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x5);
    auVar23[6] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x6);
    auVar23[7] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                  ((_Base_ptr)local_2b0._0_8_)->field_0x7);
    auVar23[8] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                  *(uchar *)&((_Base_ptr)local_2b0._0_8_)->_M_parent);
    auVar23[9] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                  *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 1));
    auVar23[10] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                   *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 2));
    auVar23[0xb] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 3));
    auVar23[0xc] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 4));
    auVar23[0xd] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 5));
    auVar23[0xe] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 6));
    auVar23[0xf] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                    == *(uchar *)((long)&((_Base_ptr)local_2b0._0_8_)->_M_parent + 7));
    auVar21[0] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                  == (uchar)uVar2);
    auVar21[1] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                  == (uchar)((ulong)uVar2 >> 8));
    auVar21[2] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                  == (uchar)((ulong)uVar2 >> 0x10));
    auVar21[3] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                  == (uchar)((ulong)uVar2 >> 0x18));
    auVar21[4] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                  == (uchar)((ulong)uVar2 >> 0x20));
    auVar21[5] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                  == (uchar)((ulong)uVar2 >> 0x28));
    auVar21[6] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                  == (uchar)((ulong)uVar2 >> 0x30));
    auVar21[7] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                  == (uchar)((ulong)uVar2 >> 0x38));
    auVar21[8] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                  == (uchar)uVar4);
    auVar21[9] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                  == (uchar)((ulong)uVar4 >> 8));
    auVar21[10] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                   == (uchar)((ulong)uVar4 >> 0x10));
    auVar21[0xb] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]
                    == (uchar)((ulong)uVar4 >> 0x18));
    auVar21[0xc] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]
                    == (uchar)((ulong)uVar4 >> 0x20));
    auVar21[0xd] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]
                    == (uchar)((ulong)uVar4 >> 0x28));
    auVar21[0xe] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]
                    == (uchar)((ulong)uVar4 >> 0x30));
    auVar21[0xf] = -(((tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]
                    == (uchar)((ulong)uVar4 >> 0x38));
    auVar21 = auVar21 & auVar23;
    local_568.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
    local_568.m_message.px = (element_type *)0x0;
    local_568.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_268._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_268._8_8_ = (element_type *)0xf4389f;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length =
         err_single_large.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._9_8_ << 8;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_0138e0a0;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
    err_single_large.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = &local_2b0;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_0138e0a0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)&package_single_giant;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_568,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xf4422c,(size_t)local_268,0xee,
               (lazy_ostream *)&err_single_large,"tx_child->GetWitnessHash()",uVar24);
    boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
    ppVar26 = this;
  }
  if ((result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2._M_local_buf[8] == '\x01') &&
     (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      field_2._M_local_buf[8] = '\0',
     (size_type *)result_single_large.m_state.super_ValidationState<PackageValidationResult>._0_8_
     != &result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_string_length)) {
    operator_delete((void *)result_single_large.m_state.
                            super_ValidationState<PackageValidationResult>._0_8_,
                    result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_string_length + 1);
  }
  TxPackageTest::create_placeholder_tx((TxPackageTest *)&giant_ptx,(size_t)this,999);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xf2;
  file_06.m_begin = (iterator)&local_4c0;
  msg_06.m_end = pvVar19;
  msg_06.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4d0,
             msg_06);
  _cVar27 = 0x6839c5;
  iVar15 = GetVirtualTransactionSize
                     ((CTransaction *)
                      CONCAT44(giant_ptx.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr._4_4_,
                               (ModeState)
                               giant_ptx.
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr),0,0);
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x18a88 < iVar15;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = (undefined1  [16])0x0;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
  ._M_allocated_capacity = (size_type)&local_298;
  local_298._0_8_ = "GetVirtualTransactionSize(*giant_ptx) > DEFAULT_ANCESTOR_SIZE_LIMIT_KVB * 1000"
  ;
  local_298.m_message.px = (element_type *)0xf442d0;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_dataplus._M_p & 0xffffffffffffff00;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_01389048;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4d8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&err_single_large,(lazy_ostream *)&result_single_large,1,0,WARN,
             _cVar27,(size_t)&local_4e0,0xf2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&err_single_large.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10));
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_result =
       giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_mode =
       (ModeState)
       giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
  _M_dataplus._M_p =
       (pointer)giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&result_single_large;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_single_giant,__l_00,(allocator_type *)&err_single_large);
  if (result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      _M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               result_single_large.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_dataplus._M_p);
  }
  pCVar11 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate_00 = &err_single_large;
  auVar6[0xf] = 0;
  auVar6._0_15_ =
       err_single_large.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_15_;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._8_16_ = auVar6 << 8;
  ProcessNewPackage(&result_single_large,pCVar11,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package_single_giant,
                    true,(optional<CFeeRate> *)client_maxfeerate_00);
  pvVar18 = (iterator)0x0;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_single_large,&package_single_giant,&result_single_large,false,(CTxMemPool *)0x0);
  if (err_single_large.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_500 = "";
    local_518 = &boost::unit_test::basic_cstring<char_const>::null;
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar27 = 0x683b64;
    file_07.m_end = (iterator)0xf6;
    file_07.m_begin = (iterator)&local_508;
    msg_07.m_end = (iterator)client_maxfeerate_00;
    msg_07.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_518,
               msg_07);
    local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
    local_2e8.m_message = (shared_ptr<boost::basic_wrap_stringstream<char>_>)0x0;
    if (err_single_large.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_00684a08;
    }
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_01388e08;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)&err_single_large;
    local_528 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_520 = "";
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_2e8,(lazy_ostream *)&local_298,1,1,WARN,_cVar27,(size_t)&local_528,0xf6);
    boost::detail::shared_count::~shared_count(&local_2e8.m_message.pn);
  }
  else {
    local_538 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_530 = "";
    local_548 = &boost::unit_test::basic_cstring<char_const>::null;
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0xf8;
    file_08.m_begin = (iterator)&local_538;
    msg_08.m_end = (iterator)client_maxfeerate_00;
    msg_08.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_548,
               msg_08);
    local_568.m_message.px = (element_type *)(local_568.m_message._1_8_ << 8);
    local_568._0_8_ = &PTR__lazy_ostream_01388f08;
    local_568.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_550 = "";
    local_2c0._0_8_ = &local_2f0;
    local_2f0._M_p._0_4_ =
         result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_result;
    local_2c8 = (undefined1  [8])&local_56c;
    local_268[0] = result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                   m_result == PCKG_TX;
    local_56c = 2;
    local_268._8_8_ = (element_type *)0x0;
    aStack_258._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
    local_2b0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_2b0.m_message.px = (element_type *)(__pthread_internal_list *)0xf4389f;
    local_280 = (_Base_ptr)local_2c0;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_0138e0e0;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2d0._M_head_impl = (_Impl *)local_2c8;
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_0138e0e0;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_268,(lazy_ostream *)&local_568,1,2,REQUIRE,0xf442d1,
               (size_t)&local_2b0,0xf8,&local_298,"PackageValidationResult::PCKG_TX",(int)&local_2e8
              );
    boost::detail::shared_count::~shared_count((shared_count *)(local_268 + 0x10));
    local_580 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_578 = "";
    local_590 = &boost::unit_test::basic_cstring<char_const>::null;
    local_588 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xf9;
    file_09.m_begin = (iterator)&local_580;
    msg_09.m_end = pvVar19;
    msg_09.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_590,
               msg_09);
    local_568.m_message.px = (element_type *)(local_568.m_message._1_8_ << 8);
    local_568._0_8_ = &PTR__lazy_ostream_01388f08;
    local_568.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_550 = "";
    local_268._0_8_ = (shared_count *)(local_268 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,
               result_single_large.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_dataplus._M_p,
               result_single_large.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_dataplus._M_p +
               result_single_large.m_state.super_ValidationState<PackageValidationResult>.
               m_reject_reason._M_string_length);
    iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268,"transaction failed");
    local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
    local_2b0.m_message.px = (element_type *)0x0;
    local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2c0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_2c0._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)local_2c8;
    local_2f0._M_p = "transaction failed";
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_013892e8;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    local_2d0._M_head_impl = (_Impl *)&local_2f0;
    local_2c8 = (undefined1  [8])local_268;
    boost::test_tools::tt_detail::report_assertion
              (&local_2b0,(lazy_ostream *)&local_568,1,2,REQUIRE,0xf4431a,(size_t)local_2c0,0xf9,
               &local_298,"\"transaction failed\"",(int)&local_2e8);
    boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
    this = ppVar26;
    if ((shared_count *)local_268._0_8_ != (shared_count *)(local_268 + 0x10)) {
      operator_delete((void *)local_268._0_8_,(ulong)(aStack_258._M_allocated_capacity + 1));
      this = ppVar26;
    }
    iVar16 = std::
             _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             ::find(&result_single_large.m_tx_results._M_t,
                    (key_type *)
                    (CONCAT44(giant_ptx.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              (ModeState)
                              giant_ptx.
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr) + 0x59));
    local_5a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_598 = "";
    local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0xfb;
    file_10.m_begin = (iterator)&local_5a0;
    msg_10.m_end = pvVar19;
    msg_10.m_begin = pvVar18;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5b0,
               msg_10);
    local_568.m_message.px = (element_type *)(local_568.m_message._1_8_ << 8);
    local_568._0_8_ = &PTR__lazy_ostream_01388f08;
    local_568.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_550 = "";
    local_268._0_8_ = local_268 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,iVar16._M_node[2]._M_left,
               (long)&(iVar16._M_node[2]._M_left)->_M_color +
               (long)&(iVar16._M_node[2]._M_right)->_M_color);
    iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268,"tx-size");
    local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar9 == 0);
    local_2b0.m_message.px = (element_type *)0x0;
    local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2c0._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_2c0._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x68;
    local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
    local_298._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_280 = (_Base_ptr)local_2c8;
    local_2f0._M_p = "tx-size";
    local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
    local_2e8._0_8_ = &PTR__lazy_ostream_01389798;
    local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar18 = (iterator)0x1;
    pvVar19 = (iterator)0x2;
    local_2d0._M_head_impl = (_Impl *)&local_2f0;
    local_2c8 = (undefined1  [8])local_268;
    boost::test_tools::tt_detail::report_assertion
              (&local_2b0,(lazy_ostream *)&local_568,1,2,REQUIRE,0xf4435d,(size_t)local_2c0,0xfb,
               &local_298,"\"tx-size\"",(int)&local_2e8);
    boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,(ulong)(aStack_258._M_allocated_capacity + 1));
    }
  }
  if ((err_single_large.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (err_single_large.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false,
     err_single_large.
     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
     ._M_payload.
     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
     .
     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ._M_payload._M_value._M_dataplus._M_p !=
     (pointer)((long)&err_single_large.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10))) {
    operator_delete((void *)err_single_large.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p,
                    err_single_large.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5b8 = "";
  file_11.m_end = (iterator)0xff;
  file_11.m_begin = (iterator)&local_5c0;
  msg_11.m_end = pvVar19;
  msg_11.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
             (size_t)&stack0xfffffffffffffa30,msg_11);
  local_2e8.m_message.px = (element_type *)(local_2e8.m_message._1_8_ << 8);
  local_2e8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_2e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d0._M_head_impl = (_Impl *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_2c8 = (undefined1  [8])
              CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                               super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                               m_node.mempool._M_t.
                               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                               .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_2b0._0_8_ = local_2c8;
  local_2c0._0_8_ = &initialPoolSize;
  local_568.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_2c8 == (undefined1  [8])(ulong)initialPoolSize);
  local_568.m_message.px = (element_type *)0x0;
  local_568.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_268._8_8_ = (element_type *)0xf4389f;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = &local_2b0;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length =
       err_single_large.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._9_8_ << 8;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&PTR__lazy_ostream_01388f48;
  err_single_large.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_280 = (_Base_ptr)local_2c0;
  local_298.m_message.px = (element_type *)(local_298.m_message._1_8_ << 8);
  local_298._0_8_ = &PTR__lazy_ostream_01388f88;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)&local_2e8,1,2,REQUIRE,0xf44395,(size_t)local_268,0xff,
             &err_single_large,"initialPoolSize",(int)&local_298);
  boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&result_single_large.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
       field_2) {
    operator_delete(result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &result_single_large.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2) {
    operator_delete(result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    result_single_large.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_single_giant);
  if (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (giant_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&result_parent_child.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
         _M_dataplus._M_p !=
      &result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
       field_2) {
    operator_delete(result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message._M_dataplus._M_p,
                    result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                    m_debug_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
         _M_dataplus._M_p !=
      &result_parent_child.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
       field_2) {
    operator_delete(result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason._M_dataplus._M_p,
                    result_parent_child.m_state.super_ValidationState<PackageValidationResult>.
                    m_reject_reason.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_parent_child);
  if (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_child.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_child.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_child.vin);
  if (0x1c < (uint)local_b4) {
    free(local_d0.indirect_contents.indirect);
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_340._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_340,
               local_340._M_head_impl);
  }
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_parent.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_parent.vin);
  if (0x1c < (uint)local_3c) {
    free(local_58.indirect_contents.indirect);
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_308._8_8_ != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_308 + 8),
               (array<unsigned_char,_32UL> *)local_308._8_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  if (*(_Manager_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00684a08:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_validation_tests)
{
    LOCK(cs_main);
    unsigned int initialPoolSize = m_node.mempool->size();

    // Parent and Child Package
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    Package package_parent_child{tx_parent, tx_child};
    const auto result_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_parent_child, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_parent_child{CheckPackageMempoolAcceptResult(package_parent_child, result_parent_child, /*expect_valid=*/true, nullptr)}) {
        BOOST_ERROR(err_parent_child.value());
    } else {
        auto it_parent = result_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = result_parent_child.m_tx_results.find(tx_child->GetWitnessHash());

        BOOST_CHECK(it_parent->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_parent)) == COIN);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());

        BOOST_CHECK(it_child->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_child)) == COIN);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());
    }
    // A single, giant transaction submitted through ProcessNewPackage fails on single tx policy.
    CTransactionRef giant_ptx = create_placeholder_tx(999, 999);
    BOOST_CHECK(GetVirtualTransactionSize(*giant_ptx) > DEFAULT_ANCESTOR_SIZE_LIMIT_KVB * 1000);
    Package package_single_giant{giant_ptx};
    auto result_single_large = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_single_giant, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_single_large{CheckPackageMempoolAcceptResult(package_single_giant, result_single_large, /*expect_valid=*/false, nullptr)}) {
        BOOST_ERROR(err_single_large.value());
    } else {
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetRejectReason(), "transaction failed");
        auto it_giant_tx = result_single_large.m_tx_results.find(giant_ptx->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_giant_tx->second.m_state.GetRejectReason(), "tx-size");
    }

    // Check that mempool size hasn't changed.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);
}